

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUse
          (PrivateToLocalPass *this,Instruction *inst,Instruction *user)

{
  uint uVar1;
  IRContext *this_00;
  bool bVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t old_type_id;
  undefined1 local_48 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_28;
  
  CVar3 = Instruction::GetCommonDebugOpcode(inst);
  if (CVar3 == CommonDebugInfoDebugGlobalVariable) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
      IRContext::BuildDebugInfoManager(this_00);
    }
    analysis::DebugInfoManager::ConvertDebugGlobalToLocalVariable
              ((this_00->debug_info_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
               _M_head_impl,inst,user);
  }
  else {
    uVar1 = inst->opcode_ - OpName;
    if (uVar1 < 0x3d) {
      if ((0x380000000000401U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return true;
      }
      if ((ulong)uVar1 == 0x3c) {
        IRContext::ForgetUses((this->super_Pass).context_,inst);
        old_type_id = 0;
        if (inst->has_type_id_ == true) {
          old_type_id = Instruction::GetSingleWordOperand(inst,0);
        }
        local_48._16_4_ = GetNewType(this,old_type_id);
        if ((_Type)local_48._16_4_ != (_Type)0x0) {
          if (inst->has_type_id_ == false) {
            __assert_fail("has_type_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          local_48._24_8_ = local_48 + 0x10;
          local_48._0_8_ = &PTR__SmallVector_00b15d78;
          local_28._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_48._8_8_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)local_48);
          local_48._0_8_ = &PTR__SmallVector_00b15d78;
          if (local_28._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_28,local_28._M_head_impl);
          }
          IRContext::AnalyzeUses((this->super_Pass).context_,inst);
          bVar2 = UpdateUses(this,inst);
          if (bVar2) {
            return true;
          }
        }
        return false;
      }
    }
    bVar2 = spvOpcodeIsDecoration(inst->opcode_);
    if (!bVar2) {
      __assert_fail("spvOpcodeIsDecoration(inst->opcode()) && \"Do not know how to update the type for this instruction.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp"
                    ,0xd7,
                    "bool spvtools::opt::PrivateToLocalPass::UpdateUse(Instruction *, Instruction *)"
                   );
    }
  }
  return true;
}

Assistant:

bool PrivateToLocalPass::UpdateUse(Instruction* inst, Instruction* user) {
  // The cases in this switch have to match the cases in |IsValidUse|.  If we
  // don't think it is valid, the optimization will not view the variable as a
  // candidate, and therefore the use will not be updated.
  if (inst->GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
    context()->get_debug_info_mgr()->ConvertDebugGlobalToLocalVariable(inst,
                                                                       user);
    return true;
  }
  switch (inst->opcode()) {
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpImageTexelPointer:  // Treat like a load
      // The type is fine because it is the type pointed to, and that does not
      // change.
      break;
    case spv::Op::OpAccessChain: {
      context()->ForgetUses(inst);
      uint32_t new_type_id = GetNewType(inst->type_id());
      if (new_type_id == 0) {
        return false;
      }
      inst->SetResultType(new_type_id);
      context()->AnalyzeUses(inst);

      // Update uses where the type may have changed.
      if (!UpdateUses(inst)) {
        return false;
      }
    } break;
    case spv::Op::OpName:
    case spv::Op::OpEntryPoint:  // entry points will be updated separately.
      break;
    default:
      assert(spvOpcodeIsDecoration(inst->opcode()) &&
             "Do not know how to update the type for this instruction.");
      break;
  }
  return true;
}